

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_address.cpp
# Opt level: O1

void __thiscall n_e_s::core::InvalidAddress::InvalidAddress(InvalidAddress *this,uint16_t addr)

{
  undefined6 in_register_00000032;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  ulong local_28 [3];
  
  *(undefined ***)this = &PTR__InvalidAddress_0022b070;
  local_28[0] = CONCAT62(in_register_00000032,addr) & 0xffffffff;
  fmt.size_ = 2;
  fmt.data_ = (char *)0x1a;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_28;
  ::fmt::v8::vformat_abi_cxx11_(&this->message_,(v8 *)"Invalid address [0x{:04X}]",fmt,args);
  return;
}

Assistant:

InvalidAddress::InvalidAddress(uint16_t addr)
        : message_(fmt::format("Invalid address [0x{:04X}]", addr)) {}